

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_qualified_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_75;
  BuiltIn builtin;
  string local_70 [32];
  string mbr_name;
  
  builtin = BuiltInMax;
  bVar1 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
  if (bVar1) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,(ulong)builtin,(ulong)type->storage);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_(&mbr_name,&this->super_CompilerGLSL,type,index);
    lVar2 = ::std::__cxx11::string::find_first_not_of((char *)&mbr_name,0x30ed65);
    if (lVar2 == -1) {
      ::std::__cxx11::string::string(local_70,"",&local_75);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)&mbr_name);
    }
    ::std::__cxx11::string::operator=((string *)&mbr_name,local_70);
    ::std::__cxx11::string::~string(local_70);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_70,this,(ulong)(type->super_IVariant).self.id,1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,(spirv_cross *)local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ed65,
               (char (*) [2])&mbr_name,in_R8);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string((string *)&mbr_name);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_qualified_member_name(const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(to_name(type.self), "_", mbr_name);
}